

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void __thiscall
vkt::BindingModel::anon_unknown_1::ComputePipeline::ComputePipeline
          (ComputePipeline *this,DeviceInterface *vki,VkDevice device,
          BinaryCollection *programCollection,deUint32 numDescriptorSets,
          VkDescriptorSetLayout *descriptorSetLayouts)

{
  deUint64 dVar1;
  Handle<(vk::HandleType)16> HVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  const_iterator cVar6;
  undefined4 in_register_00000084;
  Unique<vk::Handle<(vk::HandleType)14>_> computeModule;
  Move<vk::Handle<(vk::HandleType)16>_> local_f8;
  key_type local_d8;
  Move<vk::Handle<(vk::HandleType)18>_> local_b8;
  undefined1 local_98 [16];
  VkDevice local_88;
  VkAllocationCallbacks *pVStack_80;
  void *local_78;
  VkPushConstantRange *local_70;
  VkShaderModule local_68;
  char *local_60;
  VkSpecializationInfo *local_58;
  VkPipelineLayout local_50;
  VkPipeline local_48;
  deInt32 local_40;
  
  pVStack_80 = (VkAllocationCallbacks *)CONCAT44(in_register_00000084,numDescriptorSets);
  local_98._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_98._8_8_ = (DeviceInterface *)0x0;
  local_88 = (VkDevice)0x100000000;
  local_78 = (void *)((ulong)local_78 & 0xffffffff00000000);
  local_70 = (VkPushConstantRange *)0x0;
  ::vk::createPipelineLayout
            (&local_f8,vki,device,(VkPipelineLayoutCreateInfo *)local_98,
             (VkAllocationCallbacks *)0x0);
  pVVar5 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  pVVar4 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  pDVar3 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  HVar2.m_internal =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_88 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  pVStack_80 = local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_98._0_8_ = local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_98._8_8_ =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal = 0;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       pVVar4;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = pVVar5;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       HVar2.m_internal;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = pDVar3;
  dVar1 = (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
          m_internal;
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x706d6f63;
  local_d8._M_string_length = 7;
  local_d8.field_2._M_allocated_capacity._4_4_ = 0x657475;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)programCollection,&local_d8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_98,vki,device,
             *(ProgramBinary **)(cVar6._M_node + 2),0);
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device = local_88;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator = pVStack_80;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal = local_98._0_8_;
  local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_98._8_8_;
  local_98._0_8_ = 0;
  local_98._8_8_ = (DeviceInterface *)0x0;
  local_88 = (VkDevice)0x0;
  pVStack_80 = (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_98._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_98._8_8_ = (DeviceInterface *)0x0;
  local_88 = (VkDevice)((ulong)local_88 & 0xffffffff00000000);
  pVStack_80 = (VkAllocationCallbacks *)CONCAT44(pVStack_80._4_4_,0x12);
  local_78 = (void *)0x0;
  local_70 = (VkPushConstantRange *)0x2000000000;
  local_68.m_internal =
       local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_60 = "main";
  local_58 = (VkSpecializationInfo *)0x0;
  local_48.m_internal = 0;
  local_40 = 0;
  local_50.m_internal = dVar1;
  ::vk::createComputePipeline
            (&local_b8,vki,device,(VkPipelineCache)0x0,(VkComputePipelineCreateInfo *)local_98,
             (VkAllocationCallbacks *)0x0);
  if (local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
               &local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkShaderModule)
               local_f8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  return;
}

Assistant:

ComputePipeline::ComputePipeline (const vk::DeviceInterface&		vki,
								  vk::VkDevice						device,
								  const vk::BinaryCollection&		programCollection,
								  deUint32							numDescriptorSets,
								  const vk::VkDescriptorSetLayout*	descriptorSetLayouts)
	: m_pipelineLayout	(createPipelineLayout(vki, device, numDescriptorSets, descriptorSetLayouts))
	, m_pipeline		(createPipeline(vki, device, programCollection, *m_pipelineLayout))
{
}